

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationWindingTests.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::tessellation::anon_unknown_7::WindingTest::createInstance(WindingTest *this,Context *context)

{
  bool bVar1;
  _func_int **pp_Var2;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  TestInstance *pTVar3;
  
  vki = Context::getInstanceInterface(context);
  physDevice = Context::getPhysicalDevice(context);
  requireFeatures(vki,physDevice,1);
  pTVar3 = (TestInstance *)operator_new(0x20);
  pp_Var2 = *(_func_int ***)&this->m_primitiveType;
  bVar1 = this->m_yFlip;
  pTVar3->m_context = context;
  pTVar3->_vptr_TestInstance = (_func_int **)&PTR__TestInstance_00d63fd8;
  pTVar3[1]._vptr_TestInstance = pp_Var2;
  *(bool *)&pTVar3[1].m_context = bVar1;
  return pTVar3;
}

Assistant:

TestInstance* WindingTest::createInstance (Context& context) const
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER);

	return new WindingTestInstance(context, m_primitiveType, m_winding, m_yFlip);
}